

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O2

bool __thiscall Xml::Parser::load(Parser *this,String *filePath,Element *element)

{
  Private *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *data_00;
  File file;
  String data;
  String local_48;
  
  File::File(&file);
  iVar2 = File::open(&file,(char *)filePath,1);
  if ((char)iVar2 == '\0') {
    uVar3 = Error::getLastError();
    Error::getErrorString(&data,uVar3);
    String::operator=(&(this->p->super_Private).errorString,&data);
    String::~String(&data);
    bVar1 = false;
  }
  else {
    data.data = &String::emptyData.super_Data;
    bVar1 = File::readAll(&file,&data);
    if (bVar1) {
      this_00 = &this->p->super_Private;
      data_00 = String::operator_cast_to_char_(&data);
      bVar1 = Private::parse(this_00,data_00,element);
    }
    else {
      uVar3 = Error::getLastError();
      Error::getErrorString(&local_48,uVar3);
      String::operator=(&(this->p->super_Private).errorString,&local_48);
      String::~String(&local_48);
      bVar1 = false;
    }
    String::~String(&data);
  }
  File::~File(&file);
  return bVar1;
}

Assistant:

bool Xml::Parser::load(const String& filePath, Element& element)
{
  File file;
  if(!file.open(filePath))
    return p->errorString = Error::getErrorString(), false;
  String data;
  if(!file.readAll(data))
    return p->errorString = Error::getErrorString(), false;
  return p->parse(data, element);
}